

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void text_sequence_line(t_text_sequence *x,t_floatarg f)

{
  int iVar1;
  _binbuf *x_00;
  t_atom *vec;
  int start;
  int end;
  int local_28;
  int local_24;
  
  x_00 = text_client_getbuf(&x->x_tc);
  if (x_00 != (_binbuf *)0x0) {
    x->x_lastto = (t_symbol *)0x0;
    vec = binbuf_getvec(x_00);
    iVar1 = binbuf_getnatom(x_00);
    iVar1 = text_nthline(iVar1,vec,(int)f,&local_28,&local_24);
    if (iVar1 == 0) {
      pd_error(x,"text sequence: line number %d out of range",(ulong)(uint)(int)f);
      local_28 = 0x7fffffff;
    }
    x->x_onset = local_28;
    x->x_eaten = '\0';
  }
  return;
}

Assistant:

static void text_sequence_line(t_text_sequence *x, t_floatarg f)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, start, end;
    t_atom *vec;
    if (!b)
       return;
    x->x_lastto = 0;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (!text_nthline(n, vec, f, &start, &end))
    {
        pd_error(x, "text sequence: line number %d out of range", (int)f);
        x->x_onset = 0x7fffffff;
    }
    else x->x_onset = start;
    x->x_eaten = 0;
}